

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::SSATransformFixVisitor::visit(SSATransformFixVisitor *this,Generator *gen)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer *this_00;
  element_type *this_01;
  bool bVar2;
  undefined1 auVar3 [8];
  undefined1 local_68 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::StmtBlock> blk_stmt;
  
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         local_68,&gen->stmts_);
  if (local_68 !=
      (undefined1  [8])
      stmts.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    p_Var1 = &blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    this_00 = &stmts.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar3 = local_68;
    do {
      this_01 = (((pointer)auVar3)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      if (this_01->type_ == Block) {
        stmts.
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"ssa","");
        bVar2 = IRNode::has_attribute(&this_01->super_IRNode,(string *)this_00);
        if (stmts.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)p_Var1) {
          operator_delete(stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)((long)&(blk_stmt.
                                          super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if (bVar2) {
          Stmt::as<kratos::StmtBlock>((Stmt *)this_00);
          if (*(int *)&stmts.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0xd].
                       super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi == 0) {
            process_always_comb((shared_ptr<kratos::StmtBlock> *)this_00);
          }
          if (blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
      }
      auVar3 = (undefined1  [8])((long)auVar3 + 0x10);
    } while (auVar3 != (undefined1  [8])
                       stmts.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          local_68);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmts = gen->get_all_stmts();
        for (auto const &stmt : stmts) {
            if (stmt->type() == StatementType::Block && stmt->has_attribute("ssa")) {
                auto blk_stmt = stmt->as<StmtBlock>();
                if (blk_stmt->block_type() == StatementBlockType::Combinational) {
                    process_always_comb(blk_stmt);
                }
            }
        }
    }